

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  string *__lhs;
  Finder *pFVar1;
  OneofDescriptor *oneof_descriptor;
  bool bVar2;
  bool bVar3;
  __type_conflict _Var4;
  int iVar5;
  Type TVar6;
  CppType CVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FieldDescriptor *this_00;
  Descriptor *pDVar8;
  Descriptor *pDVar9;
  FieldDescriptor *pFVar10;
  MessageFactory *factory;
  LogMessage *other;
  MessageLite *this_01;
  Reflection *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  string prefix;
  string full_type_name;
  string serialized_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string field_name;
  int32 field_number;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ParseLocation local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_03;
  
  pbVar11 = &prefix;
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  pDVar8 = (Descriptor *)CONCAT44(extraout_var,iVar5);
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  local_78.line = (this->tokenizer_).current_.line;
  local_78.column = (this->tokenizer_).current_.column;
  bVar2 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar2) {
    std::__cxx11::string::string((string *)&full_type_name,"[",(allocator *)&prefix);
    bVar2 = TryConsume(this,&full_type_name);
    std::__cxx11::string::~string((string *)&full_type_name);
    if (bVar2) {
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      full_type_name._M_string_length = 0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
      prefix._M_string_length = 0;
      prefix.field_2._M_local_buf[0] = '\0';
      bVar2 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
      if (bVar2) {
        std::__cxx11::string::string((string *)&serialized_value,"]",(allocator *)&local_108);
        bVar2 = Consume(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        if (!bVar2) goto LAB_00271531;
        std::__cxx11::string::string((string *)&serialized_value,":",(allocator *)&local_108);
        TryConsume(this,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        serialized_value._M_dataplus._M_p = (pointer)&serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          pDVar8 = anon_unknown_19::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
        }
        else {
          iVar5 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&prefix,&full_type_name);
          pDVar8 = (Descriptor *)CONCAT44(extraout_var_00,iVar5);
        }
        if (pDVar8 == (Descriptor *)0x0) {
          std::operator+(&local_98,"Could not find type \"",&prefix);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_number,&local_98,&full_type_name);
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &field_number,"\" stored in google.protobuf.Any.");
          ReportError(this,&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&field_number);
          pbVar11 = &local_98;
LAB_002717a5:
          std::__cxx11::string::~string((string *)pbVar11);
LAB_002717aa:
          bVar2 = false;
        }
        else {
          bVar2 = ConsumeAnyValue(this,pDVar8,&serialized_value);
          if (!bVar2) goto LAB_002717aa;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((*(int *)(any_type_url_field + 0x3c) != 3 &&
               (bVar2 = Reflection::HasField(this_02,message,any_type_url_field), bVar2)) ||
              ((*(int *)(any_value_field + 0x3c) != 3 &&
               (bVar2 = Reflection::HasField(this_02,message,any_value_field), bVar2)))))) {
            std::__cxx11::string::string
                      ((string *)&local_108,"Non-repeated Any specified multiple times.",
                       (allocator *)&field_number);
            ReportError(this,&local_108);
            pbVar11 = &local_108;
            goto LAB_002717a5;
          }
          std::operator+(&local_50,&prefix,&full_type_name);
          Reflection::SetString(this_02,message,any_type_url_field,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::string((string *)&local_70,(string *)&serialized_value);
          Reflection::SetString(this_02,message,any_value_field,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)&serialized_value);
      }
      else {
LAB_00271531:
        bVar2 = false;
      }
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&full_type_name);
      goto LAB_00271f99;
    }
  }
  std::__cxx11::string::string((string *)&full_type_name,"[",(allocator *)&prefix);
  bVar2 = TryConsume(this,&full_type_name);
  std::__cxx11::string::~string((string *)&full_type_name);
  if (!bVar2) {
    bVar2 = ConsumeIdentifier(this,&field_name);
    if (!bVar2) goto LAB_00271f97;
    if ((this->allow_field_number_ == true) &&
       (bVar2 = safe_strto32(&field_name,&field_number), bVar2)) {
      bVar2 = Descriptor::IsExtensionNumber(pDVar8,field_number);
      if (!bVar2) {
        bVar3 = Descriptor::IsReservedNumber(pDVar8,field_number);
        bVar2 = true;
        if (!bVar3) {
          pFVar10 = Descriptor::FindFieldByNumber(pDVar8,field_number);
          goto LAB_0027190b;
        }
        goto LAB_00271d76;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        pFVar10 = anon_unknown_19::DefaultFinderFindExtensionByNumber(pDVar8,field_number);
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[3])(pFVar1,pDVar8);
        pFVar10 = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar5);
      }
LAB_0027190b:
      if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_00271917;
LAB_00271cd7:
      if (this->allow_unknown_field_ != false) {
        std::operator+(&local_108,"Message type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar8 + 8));
        std::operator+(&serialized_value,&local_108,"\" has no field named \"");
        std::operator+(&prefix,&serialized_value,&field_name);
        std::operator+(&full_type_name,&prefix,"\".");
        ReportWarning(this,&full_type_name);
        goto LAB_00271d4b;
      }
      std::operator+(&local_108,"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pDVar8 + 8));
      std::operator+(&serialized_value,&local_108,"\" has no field named \"");
      std::operator+(&prefix,&serialized_value,&field_name);
      std::operator+(&full_type_name,&prefix,"\".");
      ReportError(this,&full_type_name);
LAB_00271f6e:
      std::__cxx11::string::~string((string *)&full_type_name);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&serialized_value);
      pbVar11 = &local_108;
LAB_00271f92:
      std::__cxx11::string::~string((string *)pbVar11);
      goto LAB_00271f97;
    }
    pFVar10 = Descriptor::FindFieldByName(pDVar8,&field_name);
    if (pFVar10 == (FieldDescriptor *)0x0) {
      std::__cxx11::string::string((string *)&full_type_name,(string *)&field_name);
      LowerString(&full_type_name);
      this_00 = Descriptor::FindFieldByName(pDVar8,&full_type_name);
      if (this_00 == (FieldDescriptor *)0x0) {
        pFVar10 = (FieldDescriptor *)0x0;
      }
      else {
        TVar6 = FieldDescriptor::type(this_00);
        pFVar10 = (FieldDescriptor *)0x0;
        if (TVar6 == TYPE_GROUP) {
          pFVar10 = this_00;
        }
      }
      std::__cxx11::string::~string((string *)&full_type_name);
      if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_002717c3;
LAB_002717f4:
      if (this->allow_case_insensitive_field_ == true) {
        std::__cxx11::string::string((string *)&full_type_name,(string *)&field_name);
        LowerString(&full_type_name);
        pFVar10 = Descriptor::FindFieldByLowercaseName(pDVar8,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
        if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_00271917;
      }
      bVar3 = Descriptor::IsReservedName(pDVar8,&field_name);
      bVar2 = true;
      if (bVar3) goto LAB_00271d76;
      goto LAB_00271cd7;
    }
LAB_002717c3:
    TVar6 = FieldDescriptor::type(pFVar10);
    if (TVar6 == TYPE_GROUP) {
      pDVar9 = FieldDescriptor::message_type(pFVar10);
      bVar2 = std::operator!=(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **
                               )pDVar9,&field_name);
      if (bVar2) goto LAB_002717f4;
    }
LAB_00271917:
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      if ((*(int *)(pFVar10 + 0x3c) == 3) ||
         (bVar2 = Reflection::HasField(this_02,message,pFVar10), !bVar2)) {
        oneof_descriptor = *(OneofDescriptor **)(pFVar10 + 0x58);
        if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
           (bVar2 = Reflection::HasOneof(this_02,message,oneof_descriptor), !bVar2))
        goto LAB_00271a9f;
        pFVar10 = Reflection::GetOneofFieldDescriptor(this_02,message,oneof_descriptor);
        std::operator+(&local_98,"Field \"",&field_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_number,&local_98,"\" is specified along with field \"");
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &field_number,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        pFVar10);
        std::operator+(&serialized_value,&local_108,"\", another member of oneof \"");
        std::operator+(&prefix,&serialized_value,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        oneof_descriptor);
        std::operator+(&full_type_name,&prefix,"\".");
        ReportError(this,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&field_number);
        pbVar11 = &local_98;
      }
      else {
        std::operator+(&prefix,"Non-repeated field \"",&field_name);
        std::operator+(&full_type_name,&prefix,"\" is specified multiple times.");
        ReportError(this,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
      }
      goto LAB_00271f92;
    }
LAB_00271a9f:
    CVar7 = FieldDescriptor::cpp_type(pFVar10);
    if (CVar7 == CPPTYPE_MESSAGE) {
      std::__cxx11::string::string((string *)&full_type_name,":",(allocator *)&prefix);
      bVar2 = TryConsume(this,&full_type_name);
      std::__cxx11::string::~string((string *)&full_type_name);
      if (((!bVar2) || (*(char *)(*(long *)(pFVar10 + 0x78) + 0x4f) != '\x01')) ||
         ((this->tokenizer_).current_.type != TYPE_STRING)) goto LAB_00271b74;
      full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
      full_type_name._M_string_length = 0;
      full_type_name.field_2._M_local_buf[0] = '\0';
      bVar2 = ConsumeString(this,&full_type_name);
      if (!bVar2) {
        pbVar11 = &full_type_name;
        goto LAB_00271f92;
      }
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        factory = (MessageFactory *)0x0;
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[5])(pFVar1,pFVar10);
        factory = (MessageFactory *)CONCAT44(extraout_var_03,iVar5);
      }
      this_01 = &Reflection::MutableMessage(this_02,message,pFVar10,factory)->super_MessageLite;
      MessageLite::ParseFromString(this_01,&full_type_name);
      std::__cxx11::string::~string((string *)&full_type_name);
    }
    else {
      std::__cxx11::string::string((string *)&full_type_name,":",(allocator *)&prefix);
      bVar2 = Consume(this,&full_type_name);
      std::__cxx11::string::~string((string *)&full_type_name);
      if (!bVar2) goto LAB_00271f97;
LAB_00271b74:
      if (*(int *)(pFVar10 + 0x3c) == 3) {
        std::__cxx11::string::string((string *)&full_type_name,"[",(allocator *)&prefix);
        bVar2 = TryConsume(this,&full_type_name);
        std::__cxx11::string::~string((string *)&full_type_name);
        if (bVar2) {
          std::__cxx11::string::string((string *)&full_type_name,"]",(allocator *)&prefix);
          bVar2 = TryConsume(this,&full_type_name);
          std::__cxx11::string::~string((string *)&full_type_name);
          if (!bVar2) {
            do {
              CVar7 = FieldDescriptor::cpp_type(pFVar10);
              if (CVar7 == CPPTYPE_MESSAGE) {
                bVar2 = ConsumeFieldMessage(this,message,this_02,pFVar10);
              }
              else {
                bVar2 = ConsumeFieldValue(this,message,this_02,pFVar10);
              }
              if (bVar2 == false) goto LAB_00271f97;
              std::__cxx11::string::string((string *)&full_type_name,"]",(allocator *)&prefix);
              bVar2 = TryConsume(this,&full_type_name);
              std::__cxx11::string::~string((string *)&full_type_name);
              if (bVar2) goto LAB_00271fe3;
              std::__cxx11::string::string((string *)&full_type_name,",",(allocator *)&prefix);
              bVar3 = Consume(this,&full_type_name);
              std::__cxx11::string::~string((string *)&full_type_name);
              bVar2 = false;
            } while (bVar3);
            goto LAB_00271f99;
          }
          goto LAB_00271fe3;
        }
      }
      CVar7 = FieldDescriptor::cpp_type(pFVar10);
      if (CVar7 == CPPTYPE_MESSAGE) {
        bVar2 = ConsumeFieldMessage(this,message,this_02,pFVar10);
      }
      else {
        bVar2 = ConsumeFieldValue(this,message,this_02,pFVar10);
      }
      if (bVar2 == false) goto LAB_00271f97;
    }
LAB_00271fe3:
    std::__cxx11::string::string((string *)&full_type_name,";",(allocator *)&serialized_value);
    bVar2 = TryConsume(this,&full_type_name);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&prefix,",",(allocator *)&local_108);
      TryConsume(this,&prefix);
      std::__cxx11::string::~string((string *)&prefix);
    }
    std::__cxx11::string::~string((string *)&full_type_name);
    if (*(char *)(*(long *)(pFVar10 + 0x78) + 0x4e) == '\x01') {
      std::operator+(&prefix,"text format contains deprecated field \"",&field_name);
      std::operator+(&full_type_name,&prefix,"\"");
      ReportWarning(this,&full_type_name);
      std::__cxx11::string::~string((string *)&full_type_name);
      std::__cxx11::string::~string((string *)&prefix);
    }
    bVar2 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar10,local_78);
    }
    goto LAB_00271f99;
  }
  bVar2 = ConsumeFullTypeName(this,&field_name);
  if (bVar2) {
    std::__cxx11::string::string((string *)&full_type_name,"]",(allocator *)&prefix);
    bVar2 = Consume(this,&full_type_name);
    std::__cxx11::string::~string((string *)&full_type_name);
    if (bVar2) {
      pFVar1 = this->finder_;
      if (pFVar1 == (Finder *)0x0) {
        pFVar10 = anon_unknown_19::DefaultFinderFindExtension(message,&field_name);
      }
      else {
        iVar5 = (*pFVar1->_vptr_Finder[2])(pFVar1,message,&field_name);
        pFVar10 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar5);
      }
      if (pFVar10 != (FieldDescriptor *)0x0) goto LAB_00271917;
      if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
        std::operator+(&local_108,"Extension \"",&field_name);
        std::operator+(&serialized_value,&local_108,"\" is not defined or is not an extension of \""
                      );
        std::operator+(&prefix,&serialized_value,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pDVar8 + 8));
        std::operator+(&full_type_name,&prefix,"\".");
        ReportError(this,&full_type_name);
        goto LAB_00271f6e;
      }
      std::operator+(&local_108,"Ignoring extension \"",&field_name);
      std::operator+(&serialized_value,&local_108,
                     "\" which is not defined or is not an extension of \"");
      std::operator+(&prefix,&serialized_value,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (pDVar8 + 8));
      std::operator+(&full_type_name,&prefix,"\".");
      ReportWarning(this,&full_type_name);
LAB_00271d4b:
      std::__cxx11::string::~string((string *)&full_type_name);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&serialized_value);
      std::__cxx11::string::~string((string *)&local_108);
      bVar2 = false;
LAB_00271d76:
      if (((this->allow_unknown_field_ == false) && (!bVar2)) &&
         ((this->allow_unknown_extension_ & 1U) == 0)) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&full_type_name,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/text_format.cc"
                   ,0x1fb);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)&full_type_name,
                           "CHECK failed: allow_unknown_field_ || allow_unknown_extension_ || reserved_field: "
                          );
        internal::LogFinisher::operator=((LogFinisher *)&prefix,other);
        internal::LogMessage::~LogMessage((LogMessage *)&full_type_name);
      }
      std::__cxx11::string::string((string *)&full_type_name,":",(allocator *)&local_108);
      bVar2 = TryConsume(this,&full_type_name);
      if (bVar2) {
        std::__cxx11::string::string((string *)&prefix,"{",(allocator *)&field_number);
        __lhs = &(this->tokenizer_).current_.text;
        _Var4 = std::operator==(__lhs,&prefix);
        if (_Var4) {
          std::__cxx11::string::~string((string *)&prefix);
          goto LAB_00271e27;
        }
        std::__cxx11::string::string((string *)&serialized_value,"<",(allocator *)&local_98);
        _Var4 = std::operator==(__lhs,&serialized_value);
        std::__cxx11::string::~string((string *)&serialized_value);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&full_type_name);
        if (!_Var4) {
          bVar2 = SkipFieldValue(this);
          goto LAB_00271f99;
        }
      }
      else {
LAB_00271e27:
        std::__cxx11::string::~string((string *)&full_type_name);
      }
      bVar2 = SkipFieldMessage(this);
      goto LAB_00271f99;
    }
  }
LAB_00271f97:
  bVar2 = false;
LAB_00271f99:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar2;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      DO(Consume("]"));
      TryConsume(":");  // ':' is optional between message labels and values.
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError("Could not find type \"" + prefix + full_type_name +
                    "\" stored in google.protobuf.Any.");
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::string(prefix + full_type_name));
      reflection->SetString(message, any_value_field, serialized_value);
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError("Extension \"" + field_name +
                      "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Ignoring extension \"" + field_name +
                        "\" which is not defined or is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      int32 field_number;
      if (allow_field_number_ &&
          safe_strto32(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group names are expected to be capitalized as they appear in the
        // .proto file, which actually matches their type names, not their
        // field names.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr &&
              field->type() != FieldDescriptor::TYPE_GROUP) {
            field = nullptr;
          }
        }
        // Again, special-case group names as described above.
        if (field != nullptr && field->type() == FieldDescriptor::TYPE_GROUP &&
            field->message_type()->name() != field_name) {
          field = nullptr;
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          LowerString(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }

      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      GOOGLE_CHECK(allow_unknown_field_ || allow_unknown_extension_ || reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError("Non-repeated field \"" + field_name +
                    "\" is specified multiple times.");
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError("Field \"" + field_name +
                    "\" is specified along with "
                    "field \"" +
                    other_field->name() +
                    "\", another member "
                    "of oneof \"" +
                    oneof->name() + "\".");
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsume(":");
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(Consume(":"));
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \"" + field_name +
                    "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }